

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len)

{
  bool bVar1;
  bool bVar2;
  short sVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  byte bVar7;
  ulong i;
  int16_t tmp;
  short sVar8;
  utf8_ptr p;
  size_t rem;
  char *local_40;
  ulong local_38;
  
  local_38 = (ulong)*(ushort *)ext;
  ext[4] = ext[4] & 0xf9;
  local_40 = ext;
  memset(ext + 5,0,(ulong)(*(ushort *)ext + 1 >> 1));
  p.p_ = str;
  rem = len;
  while (rem != 0) {
    wVar4 = utf8_ptr::s_getch(p.p_);
    iVar5 = is_space(wVar4);
    if (iVar5 == 0) {
      if (rem == 0) break;
      wVar4 = utf8_ptr::s_getch(p.p_);
      if (wVar4 == L'+') {
        bVar7 = 0;
      }
      else {
        if (rem == 0) break;
        wVar4 = utf8_ptr::s_getch(p.p_);
        bVar7 = 1;
        if (wVar4 != L'-') break;
      }
      utf8_ptr::inc(&p,&rem);
      goto LAB_0026237f;
    }
    utf8_ptr::inc(&p,&rem);
  }
  bVar7 = 0;
LAB_0026237f:
  local_40[4] = local_40[4] & 0xfeU | bVar7;
  while (rem != 0) {
    wVar4 = utf8_ptr::s_getch(p.p_);
    iVar5 = is_space(wVar4);
    if (iVar5 == 0) break;
    utf8_ptr::inc(&p,&rem);
  }
  bVar2 = false;
  bVar7 = 0;
  i = 0;
  sVar8 = 0;
  while (rem != 0) {
    wVar4 = utf8_ptr::s_getch(p.p_);
    if ((uint)(wVar4 + L'\xffffffd0') < 10) {
      if (wVar4 != L'0' || bVar2) {
        if (i < local_38) {
          set_dig(local_40,i,wVar4 + L'\xffffffd0');
          i = i + 1;
        }
        sVar8 = sVar8 + (ushort)(byte)~bVar7;
        bVar2 = true;
      }
      else {
        sVar8 = sVar8 - (ushort)bVar7;
        bVar2 = false;
      }
    }
    else {
      bVar1 = (bool)(wVar4 != L'.' | bVar7);
      bVar7 = 1;
      if (bVar1) {
        if ((wVar4 & 0xffffffdfU) == 0x45) {
          utf8_ptr::inc(&p,&rem);
          bVar2 = true;
          if (rem != 0) {
            wVar4 = utf8_ptr::s_getch(p.p_);
            if (wVar4 == L'+') {
LAB_002624a2:
              utf8_ptr::inc(&p,&rem);
              bVar2 = wVar4 == L'+';
            }
            else if (rem != 0) {
              wVar6 = utf8_ptr::s_getch(p.p_);
              if (wVar6 == L'-') goto LAB_002624a2;
            }
          }
          iVar5 = 0;
          goto LAB_002624c0;
        }
        break;
      }
    }
    utf8_ptr::inc(&p,&rem);
  }
LAB_00262500:
  *(short *)(local_40 + 2) = sVar8;
  normalize(local_40);
  return;
LAB_002624c0:
  if (rem == 0) goto LAB_002624f2;
  wVar4 = utf8_ptr::s_getch(p.p_);
  if (9 < (uint)(wVar4 + L'\xffffffd0')) goto LAB_002624f2;
  iVar5 = wVar4 + L'\xffffffd0' + iVar5 * 10;
  utf8_ptr::inc(&p,&rem);
  goto LAB_002624c0;
LAB_002624f2:
  sVar3 = -(short)iVar5;
  if (bVar2) {
    sVar3 = (short)iVar5;
  }
  sVar8 = sVar8 + sVar3;
  goto LAB_00262500;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len)
{
    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the type to number */
    set_type(ext, VMBN_T_NUM);

    /* initially zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* initialize the exponent to zero */
    int exp = 0;

    /* presume it will be positive */
    int neg = FALSE;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* set the sign */
    set_neg(ext, neg);

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* we haven't yet found a significant digit */
    int significant = FALSE;

    /* shift the digits into the value */
    int pt = FALSE;
    for (size_t idx = 0 ; rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;

        /* get this character */
        ch = p.getch();

        /* check for a digit */
        if (is_digit(ch))
        {
            /* 
             *   if it's not a zero, we're definitely into the significant
             *   part of the number 
             */
            if (ch != '0')
                significant = TRUE;

            /* 
             *   if it's significant, add it to the number - skip leading
             *   zeros, since they add no information to the number 
             */
            if (significant)
            {
                /* if we're not out of precision, add the digit */
                if (idx < prec)
                {
                    /* set the next digit */
                    set_dig(ext, idx, value_of_digit(ch));

                    /* move on to the next digit position */
                    ++idx;
                }

                /* 
                 *   that's another factor of 10 if we haven't found the
                 *   decimal point (whether or not we're out of precision to
                 *   actually store the digit, count the increase in the
                 *   exponent) 
                 */
                if (!pt)
                    ++exp;
            }
            else if (pt)
            {
                /* 
                 *   we haven't yet found a significant digit, so this is a
                 *   leading zero, but we have found the decimal point - this
                 *   reduces the exponent by one 
                 */
                --exp;
            }
        }
        else if (ch == '.' && !pt)
        {
            /* 
             *   this is the decimal point - note it; from now on, we won't
             *   increase the exponent as we add digits 
             */
            pt = TRUE;
        }
        else if (ch == 'e' || ch == 'E')
        {
            int acc;
            int exp_neg = FALSE;

            /* exponent - skip the 'e' */
            p.inc(&rem);

            /* check for a sign */
            if (rem != 0 && p.getch() == '+')
            {
                /* skip the sign */
                p.inc(&rem);
            }
            else if (rem != 0 && p.getch() == '-')
            {
                /* skip it and note it */
                p.inc(&rem);
                exp_neg = TRUE;
            }

            /* parse the exponent */
            for (acc = 0 ; rem != 0 ; p.inc(&rem))
            {
                wchar_t ch;

                /* if this is a digit, add it to the exponent */
                ch = p.getch();
                if (is_digit(ch))
                {
                    /* accumulate the digit */
                    acc *= 10;
                    acc += value_of_digit(ch);
                }
                else
                {
                    /* that's it for the exponent */
                    break;
                }
            }

            /* if it's negative, apply the sign */
            if (exp_neg)
                acc = -acc;

            /* add the exponent to the one we've calculated */
            exp += acc;

            /* after the exponent, we're done with the whole number */
            break;
        }
        else
        {
            /* it looks like we've reached the end of the number */
            break;
        }
    }

    /* set the exponent */
    set_exp(ext, exp);

    /* normalize the number */
    normalize(ext);
}